

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O1

char * Nnc_LayerType2Str(char *pStr)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = strcmp(pStr,"InputLayer");
  if (iVar1 == 0) {
    pcVar2 = "input  ";
  }
  else {
    iVar1 = strcmp(pStr,"Conv2D");
    if (iVar1 == 0) {
      pcVar2 = "convo  ";
    }
    else {
      iVar1 = strcmp(pStr,"BatchNormalization");
      if (iVar1 == 0) {
        pcVar2 = "batch  ";
      }
      else {
        iVar1 = strcmp(pStr,"Activation");
        if (iVar1 == 0) {
          pcVar2 = "relu   ";
        }
        else {
          iVar1 = strcmp(pStr,"Add");
          if (iVar1 == 0) {
            pcVar2 = "eltwise";
          }
          else {
            iVar1 = strcmp(pStr,"MaxPooling2D");
            pcVar2 = "pool   ";
            if ((iVar1 != 0) && (iVar1 = strcmp(pStr,"GlobalAveragePooling2D"), iVar1 != 0)) {
              iVar1 = strcmp(pStr,"Dense");
              if (iVar1 == 0) {
                pcVar2 = "fullcon";
              }
              else {
                iVar1 = strcmp(pStr,"ZeroPadding2D");
                pcVar2 = (char *)0x0;
                if (iVar1 == 0) {
                  pcVar2 = "pad";
                }
              }
            }
          }
        }
      }
    }
  }
  return pcVar2;
}

Assistant:

char * Nnc_LayerType2Str( char * pStr )
{
    if ( !strcmp(pStr, "InputLayer") )
        return "input  ";
    if ( !strcmp(pStr, "Conv2D") )
        return "convo  ";
    if ( !strcmp(pStr, "BatchNormalization") )
        return "batch  ";
    if ( !strcmp(pStr, "Activation") )
        return "relu   ";
    if ( !strcmp(pStr, "Add") )
        return "eltwise";
    if ( !strcmp(pStr, "MaxPooling2D") )
        return "pool   ";
    if ( !strcmp(pStr, "GlobalAveragePooling2D") )
        return "pool   ";
    if ( !strcmp(pStr, "Dense") )
        return "fullcon";
    if ( !strcmp(pStr, "ZeroPadding2D") )
        return "pad";
//    if ( !strcmp(pStr, "InputLayer") )
//        return "softmax";
    return NULL;
}